

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::scrollTo(QColumnView *this,QModelIndex *index,ScrollHint hint)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QColumnViewPrivate *this_00;
  long lVar4;
  qsizetype qVar5;
  const_reference ppQVar6;
  QStyle *pQVar7;
  undefined8 in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int animationDuration;
  int newScrollbarValue;
  int visibleWidth;
  int indexColumn;
  int currentColumn;
  QColumnViewPrivate *d;
  int rightEdge;
  int leftEdge;
  QModelIndex indexParent;
  QWidget *in_stack_fffffffffffffef8;
  QModelIndex *in_stack_ffffffffffffff00;
  QPropertyAnimation *pQVar8;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 build;
  QModelIndex *in_stack_ffffffffffffff38;
  int local_b0;
  int local_ac;
  int local_a4;
  int local_64;
  int local_44;
  QVariant local_28;
  long local_8;
  
  build = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QColumnView *)0x8638cf);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff00);
  if (((bVar1) &&
      (bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x8638f5), !bVar1))
     && (iVar2 = QAbstractAnimation::state(), iVar2 != 2)) {
    QAbstractAnimation::stop();
    QColumnViewPrivate::closeColumns(in_RDI,in_stack_ffffffffffffff38,(bool)build);
    QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                       );
    local_a4 = 0;
    local_44 = 0;
    while( true ) {
      lVar4 = (long)local_a4;
      qVar5 = QList<QAbstractItemView_*>::size(&this_00->columns);
      if (qVar5 <= lVar4) break;
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff00,
                 (qsizetype)in_stack_fffffffffffffef8);
      QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff00);
      bVar1 = ::operator==(in_stack_ffffffffffffff00,(QModelIndex *)in_stack_fffffffffffffef8);
      if (bVar1) break;
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff00,
                 (qsizetype)in_stack_fffffffffffffef8);
      iVar2 = QWidget::width((QWidget *)0x863a1b);
      local_44 = iVar2 + local_44;
      local_a4 = local_a4 + 1;
    }
    lVar4 = (long)local_a4;
    qVar5 = QList<QAbstractItemView_*>::size(&this_00->columns);
    if (lVar4 != qVar5) {
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff00,
                 (qsizetype)in_stack_fffffffffffffef8);
      local_ac = QWidget::width((QWidget *)0x863a8c);
      qVar5 = QList<QAbstractItemView_*>::size(&this_00->columns);
      if (local_a4 + 1 < qVar5) {
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff00,
                   (qsizetype)in_stack_fffffffffffffef8);
        iVar2 = QWidget::width((QWidget *)0x863ae5);
        local_ac = iVar2 + local_ac;
      }
      local_64 = local_44 + local_ac;
      bVar1 = QWidget::isRightToLeft((QWidget *)0x863b09);
      if (bVar1) {
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff00);
        iVar2 = QWidget::width((QWidget *)0x863b21);
        local_44 = iVar2 - local_44;
        local_64 = local_44 - local_ac;
        qSwap<int>(&in_stack_ffffffffffffff00->r,(int *)in_stack_fffffffffffffef8);
      }
      iVar2 = (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).
                                     super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                     super_QWidgetPrivate + 0x2b0))();
      bVar1 = false;
      if (local_44 != -iVar2 && SBORROW4(local_44,-iVar2) == local_44 + iVar2 < 0) {
        in_stack_ffffffffffffff1c = local_64;
        in_stack_ffffffffffffff18 =
             (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).
                                    super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                    super_QWidgetPrivate + 0x2b0))();
        in_stack_ffffffffffffff18 = -in_stack_ffffffffffffff18;
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff00);
        QWidget::size(in_stack_fffffffffffffef8);
        iVar2 = QSize::width((QSize *)0x863bcb);
        bVar1 = in_stack_ffffffffffffff1c <= in_stack_ffffffffffffff18 + iVar2;
      }
      if (bVar1) {
        ppQVar6 = QList<QAbstractItemView_*>::at
                            ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff00,
                             (qsizetype)in_stack_fffffffffffffef8);
        (**(code **)(*(long *)&((*ppQVar6)->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                    0x1e8))(*ppQVar6,in_RSI,0);
        QColumnViewPrivate::changeCurrentColumn(this_00);
      }
      else {
        bVar1 = QWidget::isRightToLeft((QWidget *)0x863c34);
        if (bVar1) {
          if (local_44 < 0) {
            QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff00);
            QWidget::size(in_stack_fffffffffffffef8);
            local_b0 = QSize::width((QSize *)0x863c6b);
            local_b0 = local_b0 - local_44;
          }
          else {
            local_b0 = (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).
                                              super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                              super_QWidgetPrivate + 0x2b0))();
            local_b0 = local_64 + local_b0;
            in_stack_ffffffffffffff14 = local_64;
          }
        }
        else {
          iVar2 = local_44;
          iVar3 = (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).
                                         super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                         super_QWidgetPrivate + 0x2b0))();
          if (iVar2 == -iVar3 || SBORROW4(iVar2,-iVar3) != iVar2 + iVar3 < 0) {
            local_b0 = local_44;
          }
          else {
            QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff00);
            QWidget::size(in_stack_fffffffffffffef8);
            local_b0 = QSize::width((QSize *)0x863cf8);
            local_b0 = local_64 - local_b0;
          }
        }
        pQVar7 = QWidget::style(in_stack_fffffffffffffef8);
        iVar2 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x71,0,in_RDI);
        if (iVar2 == 0) {
          QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00)
          ;
          QAbstractSlider::setValue
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff14);
        }
        else {
          QVariantAnimation::setDuration((int)this_00 + 0x578);
          pQVar8 = &this_00->currentAnimation;
          ::QVariant::QVariant(&local_28,local_b0);
          iVar2 = (int)this_00;
          QVariantAnimation::setEndValue((QVariant *)pQVar8);
          ::QVariant::~QVariant(&local_28);
          QAbstractAnimation::start(iVar2 + 0x578);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QColumnView);
    Q_UNUSED(hint);
    if (!index.isValid() || d->columns.isEmpty())
        return;

#if QT_CONFIG(animation)
    if (d->currentAnimation.state() == QPropertyAnimation::Running)
        return;

    d->currentAnimation.stop();
#endif // animation

    // Fill up what is needed to get to index
    d->closeColumns(index, true);

    QModelIndex indexParent = index.parent();
    // Find the left edge of the column that contains index
    int currentColumn = 0;
    int leftEdge = 0;
    while (currentColumn < d->columns.size()) {
        if (indexParent == d->columns.at(currentColumn)->rootIndex())
            break;
        leftEdge += d->columns.at(currentColumn)->width();
        ++currentColumn;
    }

    // Don't let us scroll above the root index
    if (currentColumn == d->columns.size())
        return;

    int indexColumn = currentColumn;
    // Find the width of what we want to show (i.e. the right edge)
    int visibleWidth = d->columns.at(currentColumn)->width();
    // We want to always try to show two columns
    if (currentColumn + 1 < d->columns.size()) {
        ++currentColumn;
        visibleWidth += d->columns.at(currentColumn)->width();
    }

    int rightEdge = leftEdge + visibleWidth;
    if (isRightToLeft()) {
        leftEdge = viewport()->width() - leftEdge;
        rightEdge = leftEdge - visibleWidth;
        qSwap(rightEdge, leftEdge);
    }

    // If it is already visible don't animate
    if (leftEdge > -horizontalOffset()
        && rightEdge <= ( -horizontalOffset() + viewport()->size().width())) {
            d->columns.at(indexColumn)->scrollTo(index);
            d->changeCurrentColumn();
            return;
    }

    int newScrollbarValue = 0;
    if (isRightToLeft()) {
        if (leftEdge < 0) {
            // scroll to the right
            newScrollbarValue = viewport()->size().width() - leftEdge;
        } else {
            // scroll to the left
            newScrollbarValue = rightEdge + horizontalOffset();
        }
    } else {
        if (leftEdge > -horizontalOffset()) {
            // scroll to the right
            newScrollbarValue = rightEdge - viewport()->size().width();
        } else {
            // scroll to the left
            newScrollbarValue = leftEdge;
        }
    }

#if QT_CONFIG(animation)
    if (const int animationDuration = style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, this)) {
        d->currentAnimation.setDuration(animationDuration);
        d->currentAnimation.setEndValue(newScrollbarValue);
        d->currentAnimation.start();
    } else
#endif // animation
    {
        horizontalScrollBar()->setValue(newScrollbarValue);
    }
}